

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters_test.cpp
# Opt level: O1

void __thiscall Sinc_ZeroHandling_Test::TestBody(Sinc_ZeroHandling_Test *this)

{
  undefined8 uVar1;
  float fVar2;
  bool bVar3;
  char *pcVar4;
  int iVar5;
  float fVar6;
  undefined1 auVar7 [16];
  Float cur;
  Float prev;
  AssertionResult gtest_ar;
  float local_70;
  float local_6c;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  float local_5c;
  internal local_58 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  undefined1 local_48 [16];
  AssertHelper local_38;
  
  local_6c = 1.0;
  iVar5 = 10000;
  local_48 = ZEXT816(0);
  do {
    fVar6 = (float)local_48._0_4_ * 3.1415927;
    auVar7 = vfmadd213ss_fma(ZEXT416((uint)fVar6),ZEXT416((uint)fVar6),
                             SUB6416(ZEXT464(0x3f800000),0));
    if ((auVar7._0_4_ != 1.0) || (fVar2 = 1.0, NAN(auVar7._0_4_))) {
      local_5c = fVar6;
      fVar6 = sinf(fVar6);
      fVar2 = fVar6 / local_5c;
    }
    local_70 = fVar2;
    testing::internal::CmpHelperLE<float,float>(local_58,"cur","prev",&local_70,&local_6c);
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_68);
      pcVar4 = "";
      if (local_50.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = ((local_50.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/filters_test.cpp"
                 ,0x16,pcVar4);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (local_68.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_68.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_68.ptr_ + 8))();
        }
        local_68.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_48._0_4_ < INFINITY) {
      uVar1 = vcmpss_avx512f(local_48,ZEXT816(0) << 0x40,0);
      fVar6 = (float)((uint)!(bool)((byte)uVar1 & 1) * (int)local_48._0_4_);
      local_48 = ZEXT416((-(uint)(fVar6 < 0.0) | 1) + (int)fVar6);
    }
    local_6c = local_70;
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  local_6c = 1.0;
  iVar5 = 10000;
  local_48._0_4_ = 0.0;
  local_48._4_4_ = 0;
  local_48._8_4_ = 0;
  local_48._12_4_ = 0;
  do {
    fVar6 = (float)local_48._0_4_ * 3.1415927;
    auVar7 = vfmadd213ss_fma(ZEXT416((uint)fVar6),ZEXT416((uint)fVar6),
                             SUB6416(ZEXT464(0x3f800000),0));
    if ((auVar7._0_4_ != 1.0) || (fVar2 = 1.0, NAN(auVar7._0_4_))) {
      local_5c = fVar6;
      fVar6 = sinf(fVar6);
      fVar2 = fVar6 / local_5c;
    }
    local_70 = fVar2;
    testing::internal::CmpHelperLE<float,float>(local_58,"cur","prev",&local_70,&local_6c);
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_68);
      pcVar4 = "";
      if (local_50.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = ((local_50.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/filters_test.cpp"
                 ,0x1f,pcVar4);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (local_68.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_68.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_68.ptr_ + 8))();
        }
        local_68.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (-INFINITY < local_48._0_4_) {
      auVar7._0_12_ = ZEXT812(0);
      auVar7._12_4_ = 0;
      uVar1 = vcmpss_avx512f(local_48,auVar7,0);
      bVar3 = (bool)((byte)uVar1 & 1);
      fVar6 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)local_48._0_4_);
      local_48 = ZEXT416((int)fVar6 + -1 + (uint)(fVar6 <= 0.0) * 2);
    }
    local_6c = local_70;
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  return;
}

Assistant:

TEST(Sinc, ZeroHandling) {
    Float x = 0;
    Float prev = 1;
    for (int i = 0; i < 10000; ++i) {
        Float cur = Sinc(x);
        EXPECT_LE(cur, prev);
        x = NextFloatUp(x);
        prev = cur;
    }

    x = -0;
    prev = 1;
    for (int i = 0; i < 10000; ++i) {
        Float cur = Sinc(x);
        EXPECT_LE(cur, prev);
        x = NextFloatDown(x);
        prev = cur;
    }
}